

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void * ncnn::fastMalloc(size_t size)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = malloc(size + 0x18);
  if (pvVar1 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)((long)pvVar1 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar2 - 8) = pvVar1;
  }
  return pvVar2;
}

Assistant:

static inline void* fastMalloc(size_t size)
{
    unsigned char* udata = (unsigned char*)malloc(size + sizeof(void*) + MALLOC_ALIGN);
    if (!udata)
        return 0;
    unsigned char** adata = alignPtr((unsigned char**)udata + 1, MALLOC_ALIGN);
    adata[-1] = udata;
    return adata;
}